

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetTooltipV(char *fmt,__va_list_tag *args)

{
  if (GImGui->DragDropWithinSourceOrTarget == true) {
    BeginTooltip();
  }
  else {
    BeginTooltipEx(0,true);
  }
  TextV(fmt,args);
  End();
  return;
}

Assistant:

void ImGui::SetTooltipV(const char* fmt, va_list args)
{
    ImGuiContext& g = *GImGui;
    if (g.DragDropWithinSourceOrTarget)
        BeginTooltip();
    else
        BeginTooltipEx(0, true);
    TextV(fmt, args);
    EndTooltip();
}